

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf_reader.c
# Opt level: O3

int read_int(char **token)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  
  skip_spaces(token);
  pcVar6 = *token;
  cVar1 = *pcVar6;
  if ((cVar1 == '-') || (cVar1 == '+')) {
    pcVar6 = pcVar6 + 1;
    *token = pcVar6;
  }
  ppuVar3 = __ctype_b_loc();
  lVar5 = (long)*pcVar6;
  if ((*(byte *)((long)*ppuVar3 + lVar5 * 2 + 1) & 8) != 0) {
    iVar4 = 0;
    do {
      pcVar6 = pcVar6 + 1;
      iVar4 = (int)(char)lVar5 + iVar4 * 10 + -0x30;
      *token = pcVar6;
      lVar5 = (long)*pcVar6;
    } while ((*(byte *)((long)*ppuVar3 + lVar5 * 2 + 1) & 8) != 0);
    iVar2 = -iVar4;
    if (cVar1 != '-') {
      iVar2 = iVar4;
    }
    return iVar2;
  }
  printf("Parsing error. Unexpected char: %c.\n");
  exit(1);
}

Assistant:

static int read_int(char **token)
{
    int value = 0;
    int neg = 0;

    skip_spaces(token);
    if (**token == '-') {
        neg = 1;
        (*token)++;
    } else if (**token == '+')
        (*token)++;

    if (!isdigit(**token)) {
        printf("Parsing error. Unexpected char: %c.\n", **token);
        exit(EXIT_FAILURE);
    }
    while (isdigit(**token)) {
        value = (value * 10) + (**token - '0');
        (*token)++;
    }
    return neg ? -value : value;
}